

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTRefCount.hpp
# Opt level: O3

void __thiscall antlr::ASTPair::advanceChildToEnd(ASTPair *this)

{
  ASTRef *pAVar1;
  AST *pAVar2;
  RefAST *this_00;
  ASTRefCount<antlr::AST> local_20;
  
  pAVar1 = (this->child).ref;
  if ((pAVar1 != (ASTRef *)0x0) && (pAVar2 = pAVar1->ptr, pAVar2 != (AST *)0x0)) {
    (*pAVar2->_vptr_AST[0xe])(&local_20);
    if (local_20.ref != (ASTRef *)0x0) {
      this_00 = &this->child;
      do {
        pAVar2 = (local_20.ref)->ptr;
        ASTRefCount<antlr::AST>::~ASTRefCount(&local_20);
        if (pAVar2 == (AST *)0x0) {
          return;
        }
        (*this_00->ref->ptr->_vptr_AST[0xe])(&local_20);
        ASTRefCount<antlr::AST>::operator=(this_00,&local_20);
        ASTRefCount<antlr::AST>::~ASTRefCount(&local_20);
        (*this_00->ref->ptr->_vptr_AST[0xe])(&local_20);
      } while (local_20.ref != (ASTRef *)0x0);
    }
    ASTRefCount<antlr::AST>::~ASTRefCount(&local_20);
  }
  return;
}

Assistant:

operator T* ()  const { return ref ? static_cast<T*>(ref->ptr) : 0; }